

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::Remove(CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
         *this,List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *list,TElementType *item)

{
  Type pPVar1;
  Type pPVar2;
  LabelInstr *pLVar3;
  undefined4 uVar4;
  int iVar5;
  Type pPVar6;
  long lVar7;
  bool bVar8;
  
  iVar5 = (list->
          super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
          ).count;
  if (0 < (long)iVar5) {
    pPVar1 = (list->
             super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
             ).buffer;
    lVar7 = 1;
    pPVar2 = pPVar1;
    do {
      pPVar6 = pPVar2 + 1;
      if ((pPVar2->first == item->first) && (pPVar2->second == item->second)) {
        if ((int)lVar7 < iVar5) {
          do {
            iVar5 = (int)lVar7 + -1;
            pPVar1[iVar5].initialized = pPVar6->initialized;
            uVar4 = *(undefined4 *)&pPVar6->field_0x4;
            pLVar3 = pPVar6->second;
            pPVar2 = pPVar1 + iVar5;
            pPVar2->first = pPVar6->first;
            *(undefined4 *)&pPVar2->field_0x4 = uVar4;
            pPVar2->second = pLVar3;
            lVar7 = lVar7 + 1;
            iVar5 = (list->
                    super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                    ).count;
            pPVar6 = pPVar6 + 1;
          } while (lVar7 < iVar5);
        }
        iVar5 = iVar5 + -1;
        (list->
        super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
        ).count = iVar5;
        *(undefined8 *)(pPVar1 + iVar5) = 0;
        pPVar1[iVar5].second = (LabelInstr *)0x0;
        *(undefined8 *)&pPVar1[iVar5].initialized = 0;
        return;
      }
      bVar8 = lVar7 != iVar5;
      lVar7 = lVar7 + 1;
      pPVar2 = pPVar6;
    } while (bVar8);
  }
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }